

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall obs::safe_list<obs::slot<int_()>_>::node::unlock(node *this,iterator *it)

{
  iterator *piVar1;
  bool bVar2;
  iterator *piVar3;
  iterator **ppiVar4;
  iterator *piVar5;
  
  if (it == (iterator *)0x0) {
    __assert_fail("it",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x1a3,
                  "void obs::safe_list<obs::slot<int ()>>::node::unlock(iterator *) [T = obs::slot<int ()>]"
                 );
  }
  bVar2 = in_creator_thread(this);
  if (bVar2) {
    piVar1 = this->creator_thread_iterator;
    piVar3 = (iterator *)0x0;
    do {
      piVar5 = piVar3;
      piVar3 = piVar1;
      if (piVar3 == (iterator *)0x0) goto LAB_001042f7;
      piVar1 = piVar3->m_next_iterator;
    } while (piVar3 != it);
    ppiVar4 = &piVar5->m_next_iterator;
    if (piVar5 == (iterator *)0x0) {
      ppiVar4 = &this->creator_thread_iterator;
    }
    *ppiVar4 = piVar3->m_next_iterator;
  }
LAB_001042f7:
  if (0 < this->locks) {
    this->locks = this->locks + -1;
    return;
  }
  __assert_fail("locks > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0x1b9,
                "void obs::safe_list<obs::slot<int ()>>::node::unlock(iterator *) [T = obs::slot<int ()>]"
               );
}

Assistant:

void safe_list<T>::node::unlock(iterator* it) {
  assert(it);

  // In this case we are unlocking just one iterator, if we are in the
  // creator thread, we've to remove this iterator from the "creator
  // thread iterators" linked-list.
  if (in_creator_thread()) {
    iterator* prev = nullptr;
    iterator* next = nullptr;
    for (auto it2=creator_thread_iterator; it2; it2=next) {
      next = it2->m_next_iterator;
      if (it2 == it) {
        if (prev)
          prev->m_next_iterator = next;
        else
          creator_thread_iterator = next;

        break;
      }
      prev = it2;
    }
  }

  assert(locks > 0);
  --locks;
}